

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void close_state(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  global_State *g;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  
  g = (global_State *)(L->glref).ptr64;
  lj_func_closeuv(L,(TValue *)(L->stack).ptr64);
  lj_gc_freeall(g);
  lj_trace_freestate(g);
  lj_ctype_freestate(g);
  pvVar3 = g->allocd;
  uVar6 = (ulong)((g->str).mask + 1);
  (g->gc).total = (g->gc).total + uVar6 * -8;
  (*g->allocf)(pvVar3,(g->str).tab,uVar6 * 8,0);
  pcVar4 = (g->tmpbuf).b;
  uVar6 = (ulong)(uint)(*(int *)&(g->tmpbuf).e - (int)pcVar4);
  (g->gc).total = (g->gc).total - uVar6;
  (*g->allocf)(g->allocd,pcVar4,uVar6,0);
  pvVar3 = (void *)(L->stack).ptr64;
  uVar2 = L->stacksize;
  (g->gc).total = (g->gc).total + (ulong)uVar2 * -8;
  (*g->allocf)(g->allocd,pvVar3,(ulong)uVar2 * 8,0);
  pvVar3 = (void *)(g->gc).lightudseg.ptr64;
  if (pvVar3 != (void *)0x0) {
    bVar1 = (g->gc).lightudnum;
    iVar5 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    sVar7 = 8;
    if (bVar1 != 0) {
      sVar7 = (ulong)(uint)(2 << ((byte)iVar5 & 0x1f)) << 2;
    }
    (g->gc).total = (g->gc).total - sVar7;
    (*g->allocf)(g->allocd,pvVar3,sVar7,0);
  }
  if (g->allocf != lj_alloc_f) {
    (*g->allocf)(g->allocd,g[-1].gcroot + 0x1a,0x1860,0);
    return;
  }
  lj_alloc_destroy(g->allocd);
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lj_assertG(gcref(g->gc.root) == obj2gco(L),
	     "main thread is not first GC object");
  lj_assertG(g->str.num == 0, "leaked %d strings", g->str.num);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_str_freetab(g);
  lj_buf_free(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
#if LJ_64
  if (mref(g->gc.lightudseg, uint32_t)) {
    MSize segnum = g->gc.lightudnum ? (2 << lj_fls(g->gc.lightudnum)) : 2;
    lj_mem_freevec(g, mref(g->gc.lightudseg, uint32_t), segnum, uint32_t);
  }
#endif
  lj_assertG(g->gc.total == sizeof(GG_State),
	     "memory leak of %lld bytes",
	     (long long)(g->gc.total - sizeof(GG_State)));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}